

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::average_down_edges(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  BoxArray *ba;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  IndexType IVar6;
  int iVar7;
  Periodicity *period;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Real facInv_1;
  Real facInv;
  double dVar16;
  int local_2fc;
  undefined1 local_2c8 [24];
  pointer local_2b0;
  undefined8 uStack_2a8;
  int local_2a0;
  long local_288;
  long local_280;
  undefined8 local_278;
  int local_270;
  uint local_26c;
  int local_268;
  int local_264;
  ulong local_258;
  FabArray<amrex::FArrayBox> *local_250;
  long local_248;
  ulong local_240;
  long local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  BoxArray local_218;
  MFIter mfi;
  
  ba = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  IVar6 = BATransformer::index_type(&ba->m_bat);
  uVar12 = 0;
  do {
    if (uVar12 == 3) {
LAB_00538688:
      Abort_host("average_down_edges: not face index type");
LAB_00538694:
      uVar1 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
      bVar5 = isMFIterSafe((FabArrayBase *)fine,(FabArrayBase *)crse);
      if (bVar5) {
        MFIter::MFIter(&mfi,(FabArrayBase *)crse,true);
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        local_258 = (ulong)uVar1;
        local_250 = &fine->super_FabArray<amrex::FArrayBox>;
        while (mfi.currentIndex < mfi.endIndex) {
          MFIter::growntilebox((Box *)&local_278,&mfi,ngcrse);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&local_218,&crse->super_FabArray<amrex::FArrayBox>,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_2c8,&fine->super_FabArray<amrex::FArrayBox>,&mfi)
          ;
          local_248 = (long)local_278._4_4_;
          local_240 = (ulong)local_26c;
          local_238 = (long)local_268;
          for (uVar13 = 0; iVar8 = local_270, uVar13 != local_258; uVar13 = uVar13 + 1) {
            for (; iVar8 <= local_264; iVar8 = iVar8 + 1) {
              uVar1 = ratio->vect[0];
              uVar2 = ratio->vect[1];
              local_288 = (long)(int)uVar2;
              uVar3 = ratio->vect[2];
              iVar10 = uVar3 * iVar8;
              uVar4 = uVar3;
              if ((int)uVar3 < 1) {
                uVar4 = 0;
              }
              local_220 = (ulong)uVar4;
              local_228 = 0;
              if (0 < (int)uVar2) {
                local_228 = (ulong)uVar2;
              }
              local_230 = 0;
              if (0 < (int)uVar1) {
                local_230 = (ulong)uVar1;
              }
              local_2fc = local_278._4_4_ * uVar2;
              lVar14 = local_248;
              while (lVar9 = lVar14, lVar9 <= local_238) {
                if ((int)local_278 <= (int)local_26c) {
                  lVar14 = (long)(int)local_278;
                  iVar7 = (int)local_278 * uVar1;
                  do {
                    if (uVar12 == 2) {
                      iVar11 = iVar10 - local_2a0;
                      dVar16 = 0.0;
                      uVar15 = local_220;
                      while (bVar5 = uVar15 != 0, uVar15 = uVar15 - 1, bVar5) {
                        dVar16 = dVar16 + *(double *)
                                           (local_2c8._0_8_ +
                                           ((lVar9 * local_288 - (long)uStack_2a8._4_4_) *
                                            local_2c8._8_8_ +
                                           (lVar14 * (int)uVar1 - (long)(int)uStack_2a8) +
                                           (long)local_2b0 * uVar13 +
                                           local_2c8._16_8_ * (long)iVar11) * 8);
                        iVar11 = iVar11 + 1;
                      }
                      dVar16 = dVar16 * (1.0 / (double)(int)uVar3);
LAB_00538a47:
                      *(double *)
                       (local_218.m_bat._0_8_ +
                       ((lVar9 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                        local_218.m_bat.m_op._4_8_ +
                       ((long)iVar8 - (long)local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                       local_218.m_bat.m_op._12_8_ +
                       local_218.m_bat.m_op._20_8_ * uVar13 +
                       (lVar14 - local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2])) * 8) = dVar16;
                    }
                    else {
                      if (uVar12 == 1) {
                        iVar11 = local_2fc - uStack_2a8._4_4_;
                        dVar16 = 0.0;
                        uVar15 = local_228;
                        while (bVar5 = uVar15 != 0, uVar15 = uVar15 - 1, bVar5) {
                          dVar16 = dVar16 + *(double *)
                                             (local_2c8._0_8_ +
                                             ((lVar14 * (int)uVar1 - (long)(int)uStack_2a8) +
                                             ((long)iVar10 - (long)local_2a0) * local_2c8._16_8_ +
                                             (long)local_2b0 * uVar13 +
                                             local_2c8._8_8_ * (long)iVar11) * 8);
                          iVar11 = iVar11 + 1;
                        }
                        dVar16 = dVar16 * (1.0 / (double)(int)uVar2);
                        goto LAB_00538a47;
                      }
                      if (uVar12 == 0) {
                        iVar11 = iVar7 - (int)uStack_2a8;
                        dVar16 = 0.0;
                        uVar15 = local_230;
                        while (bVar5 = uVar15 != 0, uVar15 = uVar15 - 1, bVar5) {
                          dVar16 = dVar16 + *(double *)
                                             (local_2c8._0_8_ +
                                             ((lVar9 * local_288 - (long)uStack_2a8._4_4_) *
                                              local_2c8._8_8_ +
                                             ((long)iVar10 - (long)local_2a0) * local_2c8._16_8_ +
                                             (long)local_2b0 * uVar13 + (long)iVar11) * 8);
                          iVar11 = iVar11 + 1;
                        }
                        dVar16 = dVar16 * (1.0 / (double)(int)uVar1);
                        goto LAB_00538a47;
                      }
                    }
                    lVar14 = lVar14 + 1;
                    iVar7 = iVar7 + uVar1;
                  } while (local_26c + 1 != (int)lVar14);
                }
                local_2fc = local_2fc + uVar2;
                local_280 = lVar9;
                lVar14 = lVar9 + 1;
              }
              fine = (MultiFab *)local_250;
            }
          }
          MFIter::operator++(&mfi);
        }
        MFIter::~MFIter(&mfi);
      }
      else {
        coarsen(&local_218,ba,ratio);
        local_2c8._0_8_ = (double *)0x1;
        local_2c8._8_8_ = (Arena *)0x0;
        local_2c8._16_8_ = (pointer)0x0;
        local_2b0 = (pointer)0x0;
        uStack_2a8 = (pointer)0x0;
        local_278 = &PTR__FabFactory_007d2928;
        MultiFab::MultiFab((MultiFab *)&mfi,&local_218,
                           &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                            distributionMap,uVar1,ngcrse,(MFInfo *)local_2c8,
                           (FabFactory<amrex::FArrayBox> *)&local_278);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2c8 + 0x10));
        BoxArray::~BoxArray(&local_218);
        average_down_edges(fine,(MultiFab *)&mfi,ratio,ngcrse);
        period = Periodicity::NonPeriodic();
        FabArray<amrex::FArrayBox>::ParallelCopy
                  (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,0,
                   uVar1,ngcrse,ngcrse,period,COPY);
        MultiFab::~MultiFab((MultiFab *)&mfi);
      }
      return;
    }
    if ((IVar6.itype >> (uVar12 & 0x1f) & 1) == 0) {
      if ((1 << ((byte)uVar12 & 0x1f) | IVar6.itype) == 7) goto LAB_00538694;
      goto LAB_00538688;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void average_down_edges (const MultiFab& fine, MultiFab& crse,
                             const IntVect& ratio, int ngcrse)
    {
        AMREX_ASSERT(crse.nComp() == fine.nComp());
        AMREX_ASSERT(fine.ixType() == crse.ixType());
        const auto type = fine.ixType();
        int dir;
        for (dir = 0; dir < AMREX_SPACEDIM; ++dir) {
            if (type.cellCentered(dir)) break;
        }
        auto tmptype = type;
        tmptype.set(dir);
        if (dir >= AMREX_SPACEDIM || !tmptype.nodeCentered()) {
            amrex::Abort("average_down_edges: not face index type");
        }
        const int ncomp = crse.nComp();
        if (isMFIterSafe(fine, crse))
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse.isFusingCandidate()) {
                auto const& crsema = crse.arrays();
                auto const& finema = fine.const_arrays();
                ParallelFor(crse, IntVect(ngcrse), ncomp,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    amrex_avgdown_edges(i,j,k,n, crsema[box_no], finema[box_no], 0, 0, ratio, dir);
                });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if(Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ngcrse);
                    Array4<Real> const& crsearr = crse.array(mfi);
                    Array4<Real const> const& finearr = fine.const_array(mfi);

                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                    {
                        amrex_avgdown_edges(i,j,k,n, crsearr, finearr, 0, 0, ratio, dir);
                    });
                }
            }
        }
        else
        {
            MultiFab ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                          ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            average_down_edges(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
        }
    }